

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall despot::Parser::Ensure(Parser *this,bool condition,string *message,TiXmlBase *base)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,condition) != 0) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
  if (base != (TiXmlBase *)0x0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->file_name_)._M_dataplus._M_p,
                        (this->file_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(base->location).row + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(-1);
}

Assistant:

void Parser::Ensure(bool condition, string message, TiXmlBase* base) const {
	if (!condition) {
		cerr << "ERROR: ";
		if (base != NULL)
			cerr << file_name_ << ":" << base->Row() << ":" << endl << " ";
		cerr << message << endl;
		exit(XML_INPUT_ERROR);
	}
}